

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcJunctionBoxType::IfcJunctionBoxType(IfcJunctionBoxType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcJunctionBoxType";
  Schema_2x3::IfcFlowFittingType::IfcFlowFittingType
            (&this->super_IfcFlowFittingType,&PTR_construction_vtable_24__00775fb8);
  *(undefined8 *)&(this->super_IfcFlowFittingType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x775e38;
  *(undefined8 *)&this->field_0x1e0 = 0x775fa0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x775e60;
  (this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x775e88;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x775eb0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x775ed8;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x775f00;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x775f28;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x775f50;
  *(undefined8 *)&(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x775f78;
  *(undefined1 **)&(this->super_IfcFlowFittingType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcJunctionBoxType() : Object("IfcJunctionBoxType") {}